

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSetFull::ToEquivClass<unsigned_int>
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<unsigned_int> *result,codepoint_t baseOffset)

{
  Char lc;
  CharSet<unsigned_int> *this_00;
  ArenaAllocator *allocator_00;
  uint uVar1;
  Char hc;
  int iVar2;
  int local_60;
  int i;
  uint n;
  uint equivl [4];
  uint local_3c;
  uint local_38;
  uint acth;
  uint h;
  uint l;
  CharSet<unsigned_int> *result_local;
  uint *tblidx_local;
  uint base_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetFull *this_local;
  
  iVar2 = 0;
  if (level == 2) {
    iVar2 = 0xff;
  }
  acth = base + iVar2 + baseOffset;
  _h = result;
  result_local = (CharSet<unsigned_int> *)tblidx;
  tblidx_local._0_4_ = base;
  tblidx_local._4_4_ = level;
  _base_local = allocator;
  allocator_local = (ArenaAllocator *)this;
  uVar1 = CharSetNode::lim(level);
  local_38 = base + uVar1 + baseOffset;
  do {
    CaseInsensitive::RangeToEquivClass
              ((uint *)result_local,acth,local_38,&local_3c,(codepoint_t *)&i);
    iVar2 = local_3c - acth;
    for (local_60 = 0; allocator_00 = _base_local, this_00 = _h, local_60 < 4;
        local_60 = local_60 + 1) {
      lc = (&i)[local_60];
      hc = Chars<unsigned_int>::Shift((&i)[local_60],iVar2);
      CharSet<unsigned_int>::SetRange(this_00,allocator_00,lc,hc);
    }
    acth = local_3c + 1;
  } while (acth <= local_38);
  return;
}

Assistant:

void CharSetFull::ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        uint l = base + (CharSetNode::levels - 1 == level ? 0xff : 0) + baseOffset;
        uint h = base + lim(level) + baseOffset;

        do
        {
            uint acth;
            C equivl[CaseInsensitive::EquivClassSize];
            CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
            uint n = acth - l;
            for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
            {
                result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
            }

            // Go around again for rest of this range
            l = acth + 1;
        }
        while (l <= h);
    }